

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_conn.cc
# Opt level: O0

void __thiscall ConnDecl::GenGapFunc(ConnDecl *this,Output *out_h,Output *out_cc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  ID *in_RDX;
  Output *in_RSI;
  AnalyzerDecl *in_RDI;
  string proto;
  ID *in_stack_ffffffffffffff48;
  ID *pIVar4;
  Env *in_stack_ffffffffffffff50;
  string local_68 [48];
  string local_38 [32];
  ID *local_18;
  Output *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  strfmt_abi_cxx11_((char *)local_38,"%s(bool is_orig, int gap_length)","NewGap");
  uVar1 = std::__cxx11::string::c_str();
  Output::println(local_10,"void %s;",uVar1);
  pIVar4 = local_18;
  AnalyzerDecl::class_name_abi_cxx11_(in_RDI);
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::c_str();
  Output::println((Output *)pIVar4,"void %s::%s",uVar1,uVar2);
  std::__cxx11::string::~string(local_68);
  Output::inc_indent((Output *)local_18);
  Output::println((Output *)local_18,"{");
  Output::println((Output *)local_18,"if ( is_orig )");
  Output::inc_indent((Output *)local_18);
  pIVar4 = local_18;
  pcVar3 = Env::LValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Output::println((Output *)pIVar4,"%s->%s(gap_length);",pcVar3,"NewGap");
  Output::dec_indent((Output *)local_18);
  Output::println((Output *)local_18,"else");
  Output::inc_indent((Output *)local_18);
  pIVar4 = local_18;
  pcVar3 = Env::LValue(in_stack_ffffffffffffff50,local_18);
  Output::println((Output *)pIVar4,"%s->%s(gap_length);",pcVar3,"NewGap");
  Output::dec_indent((Output *)local_18);
  Output::println((Output *)local_18,"}");
  Output::dec_indent((Output *)local_18);
  Output::println((Output *)local_18,"");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ConnDecl::GenGapFunc(Output* out_h, Output* out_cc)
	{
	string proto = strfmt("%s(bool is_orig, int gap_length)", kFlowGap);

	out_h->println("void %s;", proto.c_str());

	out_cc->println("void %s::%s", class_name().c_str(), proto.c_str());
	out_cc->inc_indent();
	out_cc->println("{");

	out_cc->println("if ( is_orig )");
	out_cc->inc_indent();
	out_cc->println("%s->%s(gap_length);", env_->LValue(upflow_id), kFlowGap);
	out_cc->dec_indent();
	out_cc->println("else");
	out_cc->inc_indent();
	out_cc->println("%s->%s(gap_length);", env_->LValue(downflow_id), kFlowGap);
	out_cc->dec_indent();

	out_cc->println("}");
	out_cc->dec_indent();
	out_cc->println("");
	}